

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

Element * ftxui::operator|=(Element *e,Decorator *d)

{
  _Manager_type p_Var1;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  __shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = d->_M_invoker;
  p_Var1 = (d->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(d->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(d->super__Function_base)._M_functor + 8);
    (d->super__Function_base)._M_manager = (_Manager_type)0x0;
    d->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  operator|((ftxui *)&local_20,(Element *)&local_30,(Decorator *)&local_58);
  std::__shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return e;
}

Assistant:

Element& operator|=(Element& e, Decorator d) {
  e = e | std::move(d);
  return e;
}